

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HostAddress_p.cpp
# Opt level: O0

bool __thiscall BamTools::Internal::HostAddress::ParseAddress(HostAddress *this)

{
  bool bVar1;
  long lVar2;
  HostAddress *in_RDI;
  uint32_t maybeIp4;
  uint8_t maybeIp6 [16];
  size_t found;
  string s;
  uint8_t *in_stack_000000b0;
  string *in_stack_000000b8;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  uint32_t ip4Address;
  string local_30 [32];
  HostAddress *maybeIp4_00;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  byte bVar3;
  
  maybeIp4_00 = in_RDI;
  std::__cxx11::string::string(local_30,(string *)&in_RDI->m_ipString);
  lVar2 = std::__cxx11::string::find((char)local_30,0x3a);
  if ((lVar2 == -1) || (bVar1 = ParseIp6(in_stack_000000b8,in_stack_000000b0), !bVar1)) {
    lVar2 = std::__cxx11::string::find((char)local_30,0x2e);
    if (lVar2 != -1) {
      ip4Address = 0;
      bVar1 = ParseIp4((string *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                       (uint32_t *)maybeIp4_00);
      if (bVar1) {
        SetAddress(in_RDI,ip4Address);
        in_RDI->m_protocol = IPv4Protocol;
        bVar3 = 1;
        goto LAB_002afe68;
      }
    }
    in_RDI->m_protocol = UnknownNetworkProtocol;
    bVar3 = 0;
  }
  else {
    SetAddress((HostAddress *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
               (uint8_t *)in_RDI);
    in_RDI->m_protocol = IPv6Protocol;
    bVar3 = 1;
  }
LAB_002afe68:
  std::__cxx11::string::~string(local_30);
  return (bool)(bVar3 & 1);
}

Assistant:

bool HostAddress::ParseAddress()
{

    // all IPv6 addresses should have a ':'
    std::string s = m_ipString;
    std::size_t found = s.find(':');
    if (found != std::string::npos) {
        // try parse IP6 address
        uint8_t maybeIp6[16];
        if (ParseIp6(s, maybeIp6)) {
            SetAddress(maybeIp6);
            m_protocol = HostAddress::IPv6Protocol;
            return true;
        }
    }

    // all IPv4 addresses should have a '.'
    found = s.find('.');
    if (found != std::string::npos) {
        uint32_t maybeIp4(0);
        if (ParseIp4(s, maybeIp4)) {
            SetAddress(maybeIp4);
            m_protocol = HostAddress::IPv4Protocol;
            return true;
        }
    }

    // else likely just a plain-text host name "www.foo.bar"
    // will need to look up IP address info later
    m_protocol = HostAddress::UnknownNetworkProtocol;
    return false;
}